

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_PREDpp_2021.h
# Opt level: O1

void __thiscall PREDpp<UFPC>::PerformLabeling(PREDpp<UFPC> *this)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  Mat1b *pMVar5;
  long lVar6;
  Mat1i *pMVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  long lVar27;
  uint *puVar28;
  long lVar29;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar4 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar4,piVar4[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar12 = (uint *)operator_new__((ulong)(((*(int *)&pMVar5->field_0xc -
                                            (*(int *)&pMVar5->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar5->field_0x8 -
                                            (*(int *)&pMVar5->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  UFPC::P_ = puVar12;
  *puVar12 = 0;
  UFPC::length_ = 1;
  uVar11 = *(uint *)&pMVar5->field_0x8;
  iVar3 = *(int *)&pMVar5->field_0xc;
  lVar26 = *(long *)&pMVar5->field_0x10;
  lVar6 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  iVar19 = iVar3 + -1;
  iVar20 = 0;
  if (iVar3 < 2) {
    lVar22 = 0;
  }
  else {
    do {
      if (*(char *)(lVar26 + iVar20) != '\0') {
        puVar12[UFPC::length_] = UFPC::length_;
        uVar10 = UFPC::length_ + 1;
        *(uint *)(lVar6 + (long)iVar20 * 4) = UFPC::length_;
        UFPC::length_ = uVar10;
        iVar21 = iVar20 + 1;
        if (iVar19 <= iVar21) {
LAB_00246060:
          lVar22 = (long)iVar21;
          if (*(char *)(lVar26 + lVar22) == '\0') goto LAB_00246077;
          uVar10 = *(uint *)(lVar6 + (long)iVar20 * 4);
          goto LAB_00246074;
        }
        lVar22 = (long)iVar21;
        while (iVar21 = iVar20, *(char *)(lVar26 + lVar22) != '\0') {
          *(undefined4 *)(lVar6 + lVar22 * 4) = *(undefined4 *)(lVar6 + (long)iVar21 * 4);
          lVar22 = lVar22 + 1;
          iVar20 = iVar21 + 1;
          if (iVar3 + -2 == iVar20) {
            iVar21 = iVar21 + 2;
            goto LAB_00246060;
          }
        }
        iVar20 = iVar21 + 1;
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar19);
    lVar22 = (long)iVar20;
  }
  if (*(char *)(lVar26 + lVar22) != '\0') {
    puVar12[UFPC::length_] = UFPC::length_;
    uVar10 = UFPC::length_;
    UFPC::length_ = UFPC::length_ + 1;
LAB_00246074:
    *(uint *)(lVar6 + lVar22 * 4) = uVar10;
  }
LAB_00246077:
  if (1 < (int)uVar11) {
    uVar18 = 1;
    lVar26 = 0;
    do {
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar22 = *(long *)&pMVar5->field_0x10;
      lVar24 = **(long **)&pMVar5->field_0x48;
      lVar17 = lVar24 * uVar18;
      lVar6 = lVar22 + lVar17;
      pcVar25 = (char *)(lVar6 - lVar24);
      lVar8 = *(long *)&pMVar7->field_0x10;
      lVar9 = **(long **)&pMVar7->field_0x48;
      lVar27 = lVar9 * uVar18;
      puVar12 = (uint *)(lVar8 + lVar27);
      puVar28 = (uint *)((long)puVar12 - lVar9);
      if (iVar3 < 2) {
        if (*(char *)(lVar22 + lVar17) != '\0') {
          if (*pcVar25 == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar10 = UFPC::length_ + 1;
            *puVar12 = UFPC::length_;
            UFPC::length_ = uVar10;
          }
          else {
            *puVar12 = *puVar28;
          }
        }
      }
      else {
        if (*(char *)(lVar22 + lVar17) == '\0') {
          uVar23 = 0;
          goto LAB_0024614f;
        }
        if (*pcVar25 == '\0') {
          if (pcVar25[1] == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar10 = UFPC::length_ + 1;
            *puVar12 = UFPC::length_;
            UFPC::length_ = uVar10;
            iVar20 = 0;
            goto LAB_002463d7;
          }
          *puVar12 = puVar28[1];
          uVar23 = 0;
          goto LAB_00246463;
        }
        *puVar12 = *puVar28;
        uVar23 = 0;
LAB_00246493:
        iVar20 = (int)uVar23;
        uVar10 = iVar20 + 1;
        if ((int)uVar10 < iVar19) {
          lVar15 = (long)iVar20;
          iVar21 = iVar20 + 1;
          lVar16 = 0;
          while( true ) {
            if (*(char *)(lVar17 + lVar15 + lVar22 + 1 + lVar16) == '\0') {
              uVar23 = (ulong)(uint)(iVar21 + (int)lVar16);
              goto LAB_0024614f;
            }
            if (*(char *)(lVar24 * lVar26 + lVar15 + lVar22 + 1 + lVar16) == '\0') break;
            *(undefined4 *)(lVar27 + lVar15 * 4 + lVar8 + 4 + lVar16 * 4) =
                 *(undefined4 *)(lVar9 * lVar26 + lVar15 * 4 + lVar8 + 4 + lVar16 * 4);
            lVar16 = lVar16 + 1;
            if ((lVar15 - iVar19) + 1 + lVar16 == 0) {
              iVar20 = iVar20 + (int)lVar16;
              uVar10 = iVar21 + (int)lVar16;
              goto LAB_00246555;
            }
          }
          uVar23 = (ulong)(uint)(iVar21 + (int)lVar16);
LAB_00246409:
          iVar20 = (int)uVar23;
          if (pcVar25[(long)iVar20 + 1] == '\0') {
            puVar12[iVar20] = puVar12[(long)iVar20 + -1];
            goto LAB_002463d7;
          }
          uVar10 = UFPC::Merge(puVar12[(long)iVar20 + -1],puVar28[(long)iVar20 + 1]);
          puVar12[iVar20] = uVar10;
LAB_00246463:
          while( true ) {
            lVar15 = (long)(int)uVar23;
            uVar23 = lVar15 + 1;
            if (iVar19 <= (int)uVar23) break;
            if (*(char *)(lVar6 + uVar23) != '\0') {
              puVar12[lVar15 + 1] = puVar28[lVar15 + 1];
              goto LAB_00246493;
            }
LAB_0024614f:
            while( true ) {
              lVar29 = (long)(int)uVar23;
              lVar15 = lVar29 << 0x20;
              lVar16 = 0;
              do {
                lVar13 = lVar15;
                lVar14 = lVar13 >> 0x20;
                if ((long)iVar19 <= lVar29 + lVar16 + 1) {
                  uVar23 = (ulong)((int)lVar16 + (int)uVar23 + 1);
                  if (*(char *)(lVar6 + uVar23) == '\0') goto LAB_002465d6;
                  if (pcVar25[uVar23] == '\0') {
                    if (pcVar25[lVar14] == '\0') {
                      UFPC::P_[UFPC::length_] = UFPC::length_;
                      uVar10 = UFPC::length_ + 1;
                      puVar12[uVar23] = UFPC::length_;
                      UFPC::length_ = uVar10;
                      goto LAB_002465d6;
                    }
                    uVar10 = puVar28[lVar14];
                  }
                  else {
                    uVar10 = puVar28[uVar23];
                  }
                  puVar12[uVar23] = uVar10;
                  goto LAB_002465d6;
                }
                lVar1 = lVar16 + 1;
                pcVar2 = (char *)(lVar22 + lVar17 + lVar29 + 1 + lVar16);
                lVar15 = lVar13 + 0x100000000;
                lVar16 = lVar1;
              } while (*pcVar2 == '\0');
              uVar23 = (uVar23 & 0xffffffff) + lVar1;
              iVar20 = (int)uVar23;
              if (*(char *)(lVar1 + lVar24 * lVar26 + lVar29 + lVar22) != '\0') {
                *(undefined4 *)(lVar29 * 4 + lVar27 + lVar8 + lVar1 * 4) =
                     *(undefined4 *)(lVar9 * lVar26 + lVar29 * 4 + lVar8 + lVar1 * 4);
                goto LAB_00246493;
              }
              lVar15 = lVar13 + 0x200000000 >> 0x20;
              if (pcVar25[lVar15] != '\0') break;
              if (pcVar25[lVar14] == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar10 = UFPC::length_ + 1;
                *(uint *)(lVar29 * 4 + lVar27 + lVar8 + lVar1 * 4) = UFPC::length_;
                UFPC::length_ = uVar10;
              }
              else {
                *(uint *)(lVar29 * 4 + lVar27 + lVar8 + lVar1 * 4) = puVar28[lVar14];
              }
LAB_002463d7:
              uVar23 = (long)iVar20 + 1;
              if (iVar19 <= (int)uVar23) {
                if (*(char *)(lVar6 + (uVar23 & 0xffffffff)) != '\0') {
                  puVar12[uVar23 & 0xffffffff] = puVar12[iVar20];
                }
                goto LAB_002465d6;
              }
              if (*(char *)(lVar6 + uVar23) != '\0') goto LAB_00246409;
            }
            if (pcVar25[lVar14] == '\0') {
              *(uint *)(lVar29 * 4 + lVar27 + lVar8 + lVar1 * 4) = puVar28[lVar15];
            }
            else {
              uVar10 = UFPC::Merge(puVar28[lVar15],puVar28[lVar14]);
              *(uint *)(lVar29 * 4 + lVar27 + lVar8 + lVar1 * 4) = uVar10;
            }
          }
          uVar23 = uVar23 & 0xffffffff;
          if (*(char *)(lVar6 + uVar23) == '\0') goto LAB_002465d6;
          uVar10 = puVar28[uVar23];
          goto LAB_002465d3;
        }
LAB_00246555:
        uVar23 = (ulong)uVar10;
        if (*(char *)(lVar6 + uVar23) != '\0') {
          if (pcVar25[uVar23] == '\0') {
            uVar10 = puVar12[iVar20];
          }
          else {
            uVar10 = puVar28[uVar23];
          }
LAB_002465d3:
          puVar12[uVar23] = uVar10;
        }
      }
LAB_002465d6:
      uVar18 = uVar18 + 1;
      lVar26 = lVar26 + 1;
    } while (uVar18 != uVar11);
  }
  puVar12 = UFPC::P_;
  uVar11 = 1;
  if (1 < UFPC::length_) {
    uVar11 = 1;
    uVar18 = 1;
    do {
      if (puVar12[uVar18] < uVar18) {
        puVar12[uVar18] = puVar12[puVar12[uVar18]];
      }
      else {
        puVar12[uVar18] = uVar11;
        uVar11 = uVar11 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
  puVar12 = UFPC::P_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar7->field_0x8) {
    lVar26 = *(long *)&pMVar7->field_0x10;
    lVar6 = **(long **)&pMVar7->field_0x48;
    lVar22 = 0;
    do {
      iVar3 = *(int *)&pMVar7->field_0xc;
      if ((long)iVar3 != 0) {
        lVar24 = 0;
        do {
          *(uint *)(lVar26 + lVar24) = puVar12[*(uint *)(lVar26 + lVar24)];
          lVar24 = lVar24 + 4;
        } while ((long)iVar3 * 4 != lVar24);
      }
      lVar22 = lVar22 + 1;
      lVar26 = lVar26 + lVar6;
    } while (lVar22 < *(int *)&pMVar7->field_0x8);
  }
  if (UFPC::P_ != (uint *)0x0) {
    operator_delete__(UFPC::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        //Conditions:
#define CONDITION_P img_row11[c - 1] > 0
#define CONDITION_Q img_row11[c] > 0
#define CONDITION_R img_row11[c + 1] > 0
#define CONDITION_S img_row00[c - 1] > 0
#define CONDITION_X img_row00[c] > 0


//Actions:
// Action 1: nothing
#define ACTION_1 
// Action 2: x<-newlabel
#define ACTION_2 img_labels_row00[c] = LabelsSolver::NewLabel();
// Action 3: x<-p
#define ACTION_3 img_labels_row00[c] = img_labels_row11[c - 1];
// Action 4: x<-q
#define ACTION_4 img_labels_row00[c] = img_labels_row11[c];
// Action 5: x<-r
#define ACTION_5 img_labels_row00[c] = img_labels_row11[c + 1];
// Action 6: x<-p+r
#define ACTION_6 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row11[c + 1], img_labels_row11[c - 1]);
// Action 7: x<-s
#define ACTION_7 img_labels_row00[c] = img_labels_row00[c - 1];
// Action 8: x<-r+s
#define ACTION_8 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row00[c - 1], img_labels_row11[c + 1]);


#define COLS w

        {
            int c = -1;

            const unsigned char* const img_row00 = img_.ptr<unsigned char>(0);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(0);
            goto fl_tree_0;
#include "labeling_PREDpp_2021_fl_forest.inc.h"
        }

        for (int r = 1; r < h; ++r) {
            int c = -1;
            // Get rows pointer
    // Row pointers for the input image 
            const unsigned char* const img_row00 = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row11 = (unsigned char *)(((char *)img_row00) + img_.step.p[0] * -1);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row11 = (unsigned *)(((char *)img_labels_row00) + img_labels_.step.p[0] * -1);
            goto cl_tree_0;
#include "labeling_PREDpp_2021_cl_forest.inc.h"

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }